

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O2

int64_t get_pixel_proj_error
                  (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
                  int use_highbitdepth,int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,
                  int *xqd,sgr_params_type *params)

{
  _func_int64_t_uint8_t_ptr_int_int_int_uint8_t_ptr_int_int32_t_ptr_int_int32_t_ptr_int_int_ptr_sgr_params_type_ptr
  **pp_Var1;
  int64_t iVar2;
  int xq [2];
  
  av1_decode_xq(xqd,xq,params);
  if (use_highbitdepth == 0) {
    pp_Var1 = &av1_lowbd_pixel_proj_error;
  }
  else {
    pp_Var1 = &av1_highbd_pixel_proj_error;
  }
  iVar2 = (**pp_Var1)(src8,width,height,src_stride,dat8,dat_stride,flt0,flt0_stride,flt1,flt1_stride
                      ,xq,params);
  return iVar2;
}

Assistant:

static int64_t get_pixel_proj_error(const uint8_t *src8, int width, int height,
                                    int src_stride, const uint8_t *dat8,
                                    int dat_stride, int use_highbitdepth,
                                    int32_t *flt0, int flt0_stride,
                                    int32_t *flt1, int flt1_stride, int *xqd,
                                    const sgr_params_type *params) {
  int xq[2];
  av1_decode_xq(xqd, xq, params);

#if CONFIG_AV1_HIGHBITDEPTH
  if (use_highbitdepth) {
    return av1_highbd_pixel_proj_error(src8, width, height, src_stride, dat8,
                                       dat_stride, flt0, flt0_stride, flt1,
                                       flt1_stride, xq, params);

  } else {
    return av1_lowbd_pixel_proj_error(src8, width, height, src_stride, dat8,
                                      dat_stride, flt0, flt0_stride, flt1,
                                      flt1_stride, xq, params);
  }
#else
  (void)use_highbitdepth;
  return av1_lowbd_pixel_proj_error(src8, width, height, src_stride, dat8,
                                    dat_stride, flt0, flt0_stride, flt1,
                                    flt1_stride, xq, params);
#endif
}